

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkState.cpp
# Opt level: O3

void __thiscall xmrig::NetworkState::stop(NetworkState *this)

{
  char *pcVar1;
  pointer puVar2;
  
  this->m_active = false;
  this->diff = 0;
  pcVar1 = (this->m_ip).m_data;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->m_ip).m_data = (char *)0x0;
  (this->m_ip).m_size = 0;
  pcVar1 = (this->m_tls).m_data;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->m_tls).m_data = (char *)0x0;
  (this->m_tls).m_size = 0;
  pcVar1 = (this->m_fingerprint).m_data;
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  (this->m_fingerprint).m_data = (char *)0x0;
  (this->m_fingerprint).m_size = 0;
  this->failures = this->failures + 1;
  puVar2 = (this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->m_latency).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  return;
}

Assistant:

void xmrig::NetworkState::stop()
{
    m_active      = false;
    diff          = 0;
    m_ip          = nullptr;
    m_tls         = nullptr;
    m_fingerprint = nullptr;

    failures++;
    m_latency.clear();
}